

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemoryRegionSection *
memory_region_find_sparc64
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion *mr,hwaddr addr,uint64_t size)

{
  Int128 *pIVar1;
  ulong uVar2;
  MemoryRegion *pMVar3;
  _Bool _Var4;
  AddressSpace *pAVar5;
  FlatRange *pFVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  MemoryRegion *pMVar12;
  ulong uVar13;
  FlatView *pFVar14;
  hwaddr hVar15;
  ulong uVar16;
  ulong local_48 [2];
  uint64_t local_38;
  undefined8 local_30;
  
  uVar16 = addr + mr->addr;
  pMVar12 = mr->container;
  while (pMVar3 = pMVar12, pMVar3 != (MemoryRegion *)0x0) {
    uVar16 = uVar16 + pMVar3->addr;
    mr = pMVar3;
    pMVar12 = pMVar3->container;
  }
  do {
    pMVar12 = mr;
    mr = pMVar12->container;
  } while (pMVar12->container != (MemoryRegion *)0x0);
  for (pAVar5 = (pMVar12->uc->address_spaces).tqh_first; pAVar5 != (AddressSpace *)0x0;
      pAVar5 = (pAVar5->address_spaces_link).tqe_next) {
    if (pMVar12 == (MemoryRegion *)pAVar5->root) goto LAB_00a1db55;
  }
  pAVar5 = (AddressSpace *)0x0;
LAB_00a1db55:
  if (pAVar5 != (AddressSpace *)0x0) {
    pFVar14 = pAVar5->current_map;
    local_48[1] = 0;
    local_30 = 0;
    local_48[0] = uVar16;
    local_38 = size;
    pFVar6 = (FlatRange *)
             bsearch(local_48,pFVar14->ranges,(ulong)pFVar14->nr,0x40,cmp_flatrange_addr);
    if (pFVar6 != (FlatRange *)0x0) {
      if (pFVar14->ranges < pFVar6) {
        do {
          uVar2 = (ulong)pFVar6[-1].addr.start;
          lVar8 = *(long *)((long)&pFVar6[-1].addr.start + 8);
          if (((-lVar8 < (long)(ulong)(uVar16 < uVar2)) ||
              (uVar11 = (ulong)pFVar6[-1].addr.size,
              (long)(ulong)(uVar16 < uVar11 + uVar2) <=
              (long)-(*(long *)((long)&pFVar6[-1].addr.size + 8) + lVar8 +
                     (ulong)CARRY8(uVar11,uVar2)))) &&
             ((lVar8 < (long)(ulong)(uVar2 < uVar16) ||
              (uVar2 = (ulong)(uVar2 < uVar16 + size), lVar10 = lVar8 - (ulong)CARRY8(uVar16,size),
              (SBORROW8(lVar8,(ulong)CARRY8(uVar16,size)) != SBORROW8(lVar10,uVar2)) ==
              (long)(lVar10 - uVar2) < 0)))) break;
          pFVar6 = pFVar6 + -1;
        } while (pFVar14->ranges < pFVar6);
      }
      uVar2 = (ulong)(pFVar6->addr).start;
      lVar8 = *(long *)((long)&(pFVar6->addr).start + 8);
      uVar11 = uVar2;
      lVar10 = lVar8;
      if (lVar8 < (long)(ulong)(uVar2 < uVar16)) {
        uVar11 = uVar16;
        lVar10 = 0;
      }
      if ((lVar10 - (ulong)(uVar11 < uVar2) != lVar8) || (0 < lVar8)) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      hVar15 = (uVar11 - uVar2) + pFVar6->offset_in_region;
      uVar13 = (ulong)CARRY8(uVar16,size);
      pIVar1 = &(pFVar6->addr).size;
      uVar7 = uVar2 + (long)*pIVar1;
      pMVar12 = pFVar6->mr;
      uVar9 = lVar8 + *(long *)((long)&(pFVar6->addr).size + 8) +
              (ulong)CARRY8(uVar2,(ulong)*pIVar1);
      uVar2 = (ulong)(uVar16 + size < uVar7);
      if ((SBORROW8(uVar13,uVar9) != SBORROW8(uVar13 - uVar9,uVar2)) !=
          (long)((uVar13 - uVar9) - uVar2) < 0) {
        uVar7 = uVar16 + size;
        uVar9 = uVar13;
      }
      lVar8 = uVar7 - uVar11;
      lVar10 = uVar9 - (uVar7 < uVar11);
      _Var4 = pFVar6->readonly;
      goto LAB_00a1dc8b;
    }
  }
  hVar15 = 0;
  pFVar14 = (FlatView *)0x0;
  pMVar12 = (MemoryRegion *)0x0;
  lVar10 = 0;
  lVar8 = 0;
  uVar11 = 0;
  _Var4 = false;
LAB_00a1dc8b:
  *(long *)&__return_storage_ptr__->size = lVar8;
  *(long *)((long)&__return_storage_ptr__->size + 8) = lVar10;
  __return_storage_ptr__->mr = pMVar12;
  __return_storage_ptr__->fv = pFVar14;
  __return_storage_ptr__->offset_within_region = hVar15;
  __return_storage_ptr__->offset_within_address_space = uVar11;
  __return_storage_ptr__->readonly = _Var4;
  *(undefined8 *)&__return_storage_ptr__->field_0x31 = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
  return __return_storage_ptr__;
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}